

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O3

ShapeRange * __thiscall
CoreML::ShapeRange::operator+(ShapeRange *__return_storage_ptr__,ShapeRange *this,size_t val)

{
  undefined4 uVar1;
  RangeValue retval;
  RangeValue local_30;
  
  ShapeRange(__return_storage_ptr__);
  RangeValue::RangeValue(&local_30);
  uVar1 = local_30._0_4_;
  if ((this->_minimum)._isUnbound == false) {
    local_30._val = (this->_minimum)._val + val;
    uVar1._0_1_ = false;
    uVar1._1_3_ = 0;
  }
  local_30._isUnbound = SUB41(uVar1,0);
  setLower(__return_storage_ptr__,&local_30);
  RangeValue::RangeValue(&local_30);
  if ((this->_maximum)._isUnbound == false) {
    local_30._val = val + (this->_maximum)._val;
    local_30._isUnbound = false;
  }
  setUpper(__return_storage_ptr__,&local_30);
  return __return_storage_ptr__;
}

Assistant:

ShapeRange ShapeRange::operator+ (size_t val) const {
    ShapeRange out;
    out.setLower(_minimum + val);
    out.setUpper(_maximum + val);
    return out;
}